

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

string * CLI::ExistingFile(string *__return_storage_ptr__,string *filename)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [6];
  bool is_dir;
  bool exist;
  stat buffer;
  string *filename_local;
  
  buffer.__glibc_reserved[2] = (__syscall_slong_t)filename;
  __file = (char *)::std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a8);
  if (iVar1 == 0) {
    if (((uint)buffer.st_nlink & 0x4000) == 0) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      ::std::operator+(__return_storage_ptr__,"File is actually a directory: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       buffer.__glibc_reserved[2]);
    }
  }
  else {
    ::std::operator+(__return_storage_ptr__,"File does not exist: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     buffer.__glibc_reserved[2]);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string ExistingFile(const std::string &filename) {
    struct stat buffer;
    bool exist = stat(filename.c_str(), &buffer) == 0;
    bool is_dir = (buffer.st_mode & S_IFDIR) != 0;
    if(!exist) {
        return "File does not exist: " + filename;
    } else if(is_dir) {
        return "File is actually a directory: " + filename;
    }
    return std::string();
}